

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::StartVector<flatbuffers::EmptyOffset,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,size_t len,size_t elemsize,size_t alignment)

{
  size_t alignment_local;
  size_t elemsize_local;
  size_t len_local;
  FlatBufferBuilderImpl<true> *this_local;
  
  NotNested(this);
  this->nested = true;
  PreAlign<unsigned_int>(this,len * elemsize);
  PreAlign(this,len * elemsize,alignment);
  return;
}

Assistant:

void StartVector(size_t len, size_t elemsize, size_t alignment) {
    NotNested();
    nested = true;
    // Align to the Length type of the vector (either 32-bit or 64-bit), so
    // that the length of the buffer can be added without padding.
    PreAlign<LenT>(len * elemsize);
    PreAlign(len * elemsize, alignment);  // Just in case elemsize > uoffset_t.
  }